

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  char *pcVar1;
  char *in_RDX;
  undefined1 local_40 [8];
  string env_var;
  
  FlagToEnvVar_abi_cxx11_((string *)local_40,(internal *)flag,in_RDX);
  pcVar1 = getenv((char *)local_40);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = default_value;
  }
  std::__cxx11::string::~string((string *)local_40);
  return pcVar1;
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == NULL ? default_value : value;
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
}